

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileConstant(jx9_gen_state *pGen)

{
  SyToken *pSVar1;
  sxu32 nLine;
  uint uVar2;
  SyToken *pSVar3;
  SyToken *pSVar4;
  jx9_vm *pjVar5;
  SySet *pSVar6;
  sxi32 sVar7;
  int iVar8;
  SySet *pSet;
  SySet *pSVar9;
  char *pcVar10;
  sxu32 SLen;
  char *zRight;
  
  pSVar3 = pGen->pIn;
  pSVar4 = pGen->pEnd;
  nLine = pSVar3->nLine;
  pSVar1 = pSVar3 + 1;
  pGen->pIn = pSVar1;
  if ((pSVar1 < pSVar4) && ((pSVar3[1].nType & 0x600c) != 0)) {
    uVar2 = pSVar3[1].sData.nByte;
    if (uVar2 == 5) {
      pcVar10 = (pSVar1->sData).zString;
      zRight = "false";
      SLen = 5;
LAB_00127384:
      sVar7 = SyStrnicmp(pcVar10,zRight,SLen);
      if (sVar7 != 0) {
LAB_0012738d:
        pGen->pIn = pSVar3 + 2;
        if ((pSVar3 + 2 < pSVar4) && ((pSVar3[2].nType & 0x400000) != 0)) {
          pGen->pIn = pSVar3 + 3;
          pSet = (SySet *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0x28);
          if (pSet == (SySet *)0x0) {
            jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
            return -10;
          }
          pjVar5 = pGen->pVm;
          pSet->nUsed = 0;
          pSet->nSize = 0;
          pSet->eSize = 0x18;
          pSet->nCursor = 0;
          pSet->pAllocator = &pjVar5->sAllocator;
          pSet->pBase = (void *)0x0;
          pSet->pUserData = (void *)0x0;
          pSVar6 = pjVar5->pByteContainer;
          pjVar5->pByteContainer = pSet;
          sVar7 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
          jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar7 != -3),0,(void *)0x0,(sxu32 *)0x0);
          pjVar5 = pGen->pVm;
          pSVar9 = &pjVar5->aByteCode;
          if (pSVar6 != (SySet *)0x0) {
            pSVar9 = pSVar6;
          }
          pjVar5->pByteContainer = pSVar9;
          if (sVar7 == -10) {
            return -10;
          }
          pSet->pUserData = pjVar5;
          sVar7 = jx9VmRegisterConstant(pjVar5,&pSVar1->sData,jx9VmExpandConstantValue,pSet);
          if (sVar7 != 0) {
            SySetRelease(pSet);
            SyMemBackendPoolFree(&pGen->pVm->sAllocator,pSet);
          }
          return 0;
        }
        pcVar10 = "const: Expected \'=\' after constant name";
        goto LAB_00127317;
      }
    }
    else {
      if (uVar2 != 4) goto LAB_0012738d;
      pcVar10 = (pSVar1->sData).zString;
      sVar7 = SyStrnicmp(pcVar10,"null",4);
      if (sVar7 != 0) {
        zRight = "true";
        SLen = 4;
        goto LAB_00127384;
      }
    }
    iVar8 = jx9GenCompileError(pGen,1,nLine,"const: Cannot redeclare a reserved constant \'%z\'",
                               pSVar1);
  }
  else {
    pcVar10 = "const: Invalid constant name";
LAB_00127317:
    iVar8 = jx9GenCompileError(pGen,1,nLine,pcVar10);
  }
  sVar7 = -10;
  if (iVar8 != -10) {
    pSVar1 = pGen->pIn;
    while ((sVar7 = 0, pSVar1 < pGen->pEnd && (sVar7 = 0, (pSVar1->nType & 0x40000) == 0))) {
      pGen->pIn = pSVar1 + 1;
      pSVar1 = pSVar1 + 1;
    }
  }
  return sVar7;
}

Assistant:

static sxi32 jx9CompileConstant(jx9_gen_state *pGen)
{
	SySet *pConsCode, *pInstrContainer;
	sxu32 nLine = pGen->pIn->nLine;
	SyString *pName;
	sxi32 rc;
	pGen->pIn++; /* Jump the 'const' keyword */
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & (JX9_TK_SSTR|JX9_TK_DSTR|JX9_TK_ID|JX9_TK_KEYWORD)) == 0 ){
		/* Invalid constant name */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "const: Invalid constant name");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Peek constant name */
	pName = &pGen->pIn->sData;
	/* Make sure the constant name isn't reserved */
	if( GenStateIsReservedID(pName) ){
		/* Reserved constant */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "const: Cannot redeclare a reserved constant '%z'", pName);
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	pGen->pIn++;
	if(pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_EQUAL /* '=' */) == 0 ){
		/* Invalid statement*/
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "const: Expected '=' after constant name");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	pGen->pIn++; /*Jump the equal sign */
	/* Allocate a new constant value container */
	pConsCode = (SySet *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator, sizeof(SySet));
	if( pConsCode == 0 ){
		return GenStateOutOfMem(pGen);
	}
	SySetInit(pConsCode, &pGen->pVm->sAllocator, sizeof(VmInstr));
	/* Swap bytecode container */
	pInstrContainer = jx9VmGetByteCodeContainer(pGen->pVm);
	jx9VmSetByteCodeContainer(pGen->pVm, pConsCode);
	/* Compile constant value */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Emit the done instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, (rc != SXERR_EMPTY ? 1 : 0), 0, 0, 0);
	jx9VmSetByteCodeContainer(pGen->pVm, pInstrContainer); 
	if( rc == SXERR_ABORT ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return SXERR_ABORT;
	}
	SySetSetUserData(pConsCode, pGen->pVm);
	/* Register the constant */
	rc = jx9VmRegisterConstant(pGen->pVm, pName, jx9VmExpandConstantValue, pConsCode);
	if( rc != SXRET_OK ){
		SySetRelease(pConsCode);
		SyMemBackendPoolFree(&pGen->pVm->sAllocator, pConsCode);
	}
	return SXRET_OK;
Synchronize:
	/* Synchronize with the next-semi-colon and avoid compiling this erroneous statement */
	while(pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}